

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::OptionParseException::~OptionParseException(OptionParseException *this)

{
  OptionParseException *this_local;
  
  ~OptionParseException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit OptionParseException(const std::string& message)
    : OptionException(message)
    {
    }